

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O1

void __thiscall
CFG::Block::AddSwitchBranchTo
          (Block *this,Block *Target,vector<unsigned_int,_std::allocator<unsigned_int>_> *Values,
          Expression *Code)

{
  size_type sVar1;
  Branch *pBVar2;
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>,_bool> pVar3;
  pair<CFG::Block_*const,_CFG::Branch_*> local_40;
  Block *local_30;
  Block *Target_local;
  
  local_30 = Target;
  sVar1 = std::
          _Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count((_Hashtable<CFG::Block_*,_std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CFG::Block_*>,_std::hash<CFG::Block_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&this->BranchesOut,&local_30);
  if (sVar1 == 0) {
    pBVar2 = Relooper::AddBranch(this->relooper,Values,Code);
    local_40.first = local_30;
    local_40.second = (Branch *)0x0;
    pVar3 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::insert
                      (&this->BranchesOut,&local_40);
    pVar3.first._M_node._M_node[1]._M_prev = (_List_node_base *)pBVar2;
    return;
  }
  __assert_fail("!contains(BranchesOut, Target)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/cfg/Relooper.cpp"
                ,0x9f,
                "void CFG::Block::AddSwitchBranchTo(Block *, std::vector<wasm::Index> &&, wasm::Expression *)"
               );
}

Assistant:

void Block::AddSwitchBranchTo(Block* Target,
                              std::vector<wasm::Index>&& Values,
                              wasm::Expression* Code) {
  // cannot add more than one branch to the same target
  assert(!contains(BranchesOut, Target));
  BranchesOut[Target] = relooper->AddBranch(std::move(Values), Code);
}